

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_repeatedImportOfSameUnitsViaDifferentComponents_Test::TestBody
          (ModelFlattening_repeatedImportOfSameUnitsViaDifferentComponents_Test *this)

{
  byte bVar1;
  char *pcVar2;
  AssertHelper local_c0 [8];
  AssertionResult gtest_ar;
  string a;
  AssertHelper local_88 [8];
  ModelPtr model;
  PrinterPtr printer;
  ImporterPtr importer;
  ParserPtr parser;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n  <units name=\"fergie_time\">\n    <unit prefix=\"mega\" units=\"second\"/>\n  </units>\n  <component name=\"average_component\">\n    <variable name=\"time\" units=\"fergie_time\" interface=\"public_and_private\"/>\n  </component>\n  <component name=\"good_component\">\n    <variable name=\"sometime\" units=\"fergie_time\" interface=\"public_and_private\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&printer,
             "modelflattening/repeatedimportofsameunitsviadifferentcomponents.xml",
             (allocator<char> *)&importer);
  fileContents((string *)&a);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&printer);
  libcellml::Importer::create(SUB81(&importer,0));
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       libcellml::Model::hasUnresolvedImports();
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((byte)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&a,(char *)&printer,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x218,a._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)&a);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&printer,"modelflattening/",(allocator<char> *)&gtest_ar);
  resourcePath((string *)&a);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&printer);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       bVar1 ^ 1;
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&a,(char *)&printer,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x21a,a._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)&a);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&a);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a._M_string_length);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)(byte)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x221,pcVar2);
    testing::internal::AssertHelper::operator=(local_88,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(ModelFlattening, repeatedImportOfSameUnitsViaDifferentComponents)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n"
        "  <units name=\"fergie_time\">\n"
        "    <unit prefix=\"mega\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"average_component\">\n"
        "    <variable name=\"time\" units=\"fergie_time\" interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "  <component name=\"good_component\">\n"
        "    <variable name=\"sometime\" units=\"fergie_time\" interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/repeatedimportofsameunitsviadifferentcomponents.xml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("modelflattening/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    auto printer = libcellml::Printer::create();

    auto a = printer->printModel(model);
    EXPECT_EQ(e, a);
}